

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_newkey(lua_State *L,Table *t,TValue *key,TValue *value)

{
  int iVar1;
  int done;
  TValue *value_local;
  TValue *key_local;
  Table *t_local;
  lua_State *L_local;
  
  if ((value->tt_ & 0xf) != 0) {
    iVar1 = insertkey(t,key,value);
    if (iVar1 == 0) {
      rehash(L,t,key);
      newcheckedkey(t,key,value);
    }
    if ((((key->tt_ & 0x40) != 0) && ((t->marked & 0x20) != 0)) &&
       ((((key->value_).gc)->marked & 0x18) != 0)) {
      luaC_barrierback_(L,(GCObject *)t);
    }
  }
  return;
}

Assistant:

static void luaH_newkey (lua_State *L, Table *t, const TValue *key,
                                                 TValue *value) {
  if (!ttisnil(value)) {  /* do not insert nil values */
    int done = insertkey(t, key, value);
    if (!done) {  /* could not find a free place? */
      rehash(L, t, key);  /* grow table */
      newcheckedkey(t, key, value);  /* insert key in grown table */
    }
    luaC_barrierback(L, obj2gco(t), key);
    /* for debugging only: any new key may force an emergency collection */
    condchangemem(L, (void)0, (void)0, 1);
  }
}